

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O1

void __thiscall vkt::TestCaseExecutor::deinit(TestCaseExecutor *this,TestCase *param_1)

{
  ostringstream *this_00;
  TestContext *this_01;
  TestCaseExecutor *pTVar1;
  long *plVar2;
  size_type *psVar3;
  ulong uVar4;
  DebugReportRecorder *pDVar5;
  Block *pBVar6;
  int iVar7;
  ScopedLogSection section;
  string local_218;
  TestLog *local_1f8;
  ScopedLogSection local_1f0;
  TestCaseExecutor *local_1e8;
  DebugReportRecorder *local_1e0;
  ulong local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  if (this->m_instance != (TestInstance *)0x0) {
    (*this->m_instance->_vptr_TestInstance[1])();
  }
  this->m_instance = (TestInstance *)0x0;
  pDVar5 = (this->m_debugReportRecorder).
           super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>.
           m_data.ptr;
  if (pDVar5 != (DebugReportRecorder *)0x0) {
    local_1f8 = ((this->m_context).m_testCtx)->m_log;
    if (((pDVar5->m_messages).m_first != (pDVar5->m_messages).m_last) ||
       ((pDVar5->m_messages).m_numElements % (pDVar5->m_messages).m_blockSize != 0)) {
      local_1b0._0_8_ = (TestLog *)(local_1b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DebugMessages","");
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Debug Messages","");
      tcu::ScopedLogSection::ScopedLogSection(&local_1f0,local_1f8,(string *)local_1b0,&local_218);
      local_1e8 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      local_1d8 = (pDVar5->m_messages).m_blockSize;
      pBVar6 = (pDVar5->m_messages).m_first;
      iVar7 = 0;
      if ((pBVar6 != (pDVar5->m_messages).m_last) ||
         ((pDVar5->m_messages).m_numElements % local_1d8 != 0)) {
        this_00 = (ostringstream *)(local_1b0 + 8);
        iVar7 = 0;
        uVar4 = 0;
        local_1e0 = pDVar5;
        do {
          if ((pBVar6->elements[uVar4].flags & 0xe) != 0) {
            local_1b0._0_8_ = local_1f8;
            std::__cxx11::ostringstream::ostringstream(this_00);
            ::vk::operator<<((ostream *)this_00,pBVar6->elements + uVar4);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            pDVar5 = local_1e0;
          }
          iVar7 = iVar7 + (uint)((pBVar6->elements[uVar4].flags >> 3 & 1) != 0);
          uVar4 = uVar4 + 1;
          if (uVar4 == local_1d8) {
            pBVar6 = pBVar6->next;
            uVar4 = 0;
          }
        } while ((pBVar6 != (pDVar5->m_messages).m_last) ||
                (uVar4 != (pDVar5->m_messages).m_numElements % (pDVar5->m_messages).m_blockSize));
      }
      pTVar1 = local_1e8;
      de::AppendList<vk::DebugReportMessage>::clear
                (&((local_1e8->m_debugReportRecorder).
                   super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
                   .m_data.ptr)->m_messages);
      if (0 < iVar7) {
        this_01 = (pTVar1->m_context).m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<(local_1b0,iVar7);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar2 = (long *)std::__cxx11::string::append((char *)local_1d0);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_218.field_2._M_allocated_capacity = *psVar3;
          local_218.field_2._8_8_ = plVar2[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = *psVar3;
          local_218._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_218._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        tcu::TestContext::setTestResult
                  (this_01,QP_TEST_RESULT_INTERNAL_ERROR,local_218._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
      }
      tcu::TestLog::endSection(local_1f0.m_log);
    }
  }
  return;
}

Assistant:

void TestCaseExecutor::deinit (tcu::TestCase*)
{
	delete m_instance;
	m_instance = DE_NULL;

	// Collect and report any debug messages
	if (m_debugReportRecorder)
	{
		// \note We are not logging INFORMATION and DEBUG messages
		static const vk::VkDebugReportFlagsEXT			errorFlags		= vk::VK_DEBUG_REPORT_ERROR_BIT_EXT;
		static const vk::VkDebugReportFlagsEXT			logFlags		= errorFlags
																		| vk::VK_DEBUG_REPORT_WARNING_BIT_EXT
																		| vk::VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT;

		typedef vk::DebugReportRecorder::MessageList	DebugMessages;

		const DebugMessages&	messages	= m_debugReportRecorder->getMessages();
		tcu::TestLog&			log			= m_context.getTestContext().getLog();

		if (messages.begin() != messages.end())
		{
			const tcu::ScopedLogSection	section		(log, "DebugMessages", "Debug Messages");
			int							numErrors	= 0;

			for (DebugMessages::const_iterator curMsg = messages.begin(); curMsg != messages.end(); ++curMsg)
			{
				if ((curMsg->flags & logFlags) != 0)
					log << tcu::TestLog::Message << *curMsg << tcu::TestLog::EndMessage;

				if ((curMsg->flags & errorFlags) != 0)
					numErrors += 1;
			}

			m_debugReportRecorder->clearMessages();

			if (numErrors > 0)
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, (de::toString(numErrors) + " API usage errors found").c_str());
		}
	}
}